

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int check_client_hello_constraints
              (ptls_context_t *ctx,st_ptls_client_hello_t *ch,void *prev_random,int ech_is_inner_ch,
              ptls_iovec_t raw_message,ptls_t *tls_cbarg)

{
  long lVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  
  if ((ch == (st_ptls_client_hello_t *)0x0) ||
     (iVar3 = (*ptls_mem_equal)(ctx->get_time,ch,0x20), iVar3 != 0)) {
    iVar3 = (int)prev_random;
    if (*(short *)&(ctx->pre_shared_key).identity.base == 0x304) {
      iVar4 = 0x46;
      if (((0x300 < *(ushort *)&ctx->random_bytes) && (iVar4 = 0x2f, (ctx->certificates).count == 1)
          ) && (*(char *)&((ctx->certificates).list)->base == '\0')) {
        if (*(long *)(ctx[1].ticket_context.bytes + 0x18) == 0) {
          if (((ulong)ctx[2].emit_certificate & 0x100000000) != 0) {
            return 0x2f;
          }
        }
        else if (((ulong)ctx[2].emit_certificate & 0x200000000) == 0) {
          return 0x2f;
        }
        if (((iVar3 == 0) || (*(long *)(ctx[1].ticket_context.bytes + 8) != 0)) &&
           ((*(long *)(ctx[1].ticket_context.bytes + 8) == 0 ||
            ((bool)*(char *)&ctx[1].on_extension == (iVar3 != 0))))) {
          iVar4 = 0;
        }
      }
    }
    else {
      iVar4 = 0x2f;
      if (iVar3 == 0) {
        if (ch == (st_ptls_client_hello_t *)0x0) {
          lVar1 = *(long *)raw_message.len;
          if (*(long *)(lVar1 + 0x80) == 0) {
            iVar3 = 0;
          }
          else {
            puVar2 = *(undefined8 **)(lVar1 + 0x80);
            iVar3 = (*(code *)*puVar2)(puVar2,(long *)raw_message.len);
          }
          if (iVar3 != 0) {
            return iVar3;
          }
        }
        iVar4 = 0x46;
      }
    }
  }
  else {
    iVar4 = 0x28;
  }
  return iVar4;
}

Assistant:

static int check_client_hello_constraints(ptls_context_t *ctx, struct st_ptls_client_hello_t *ch, const void *prev_random,
                                          int ech_is_inner_ch, ptls_iovec_t raw_message, ptls_t *tls_cbarg)
{
    int is_second_flight = prev_random != 0;

    /* The following check is necessary so that we would be able to track the connection in SSLKEYLOGFILE, even though it might not
     * be for the safety of the protocol. */
    if (is_second_flight && !ptls_mem_equal(ch->random_bytes, prev_random, PTLS_HELLO_RANDOM_SIZE))
        return PTLS_ALERT_HANDSHAKE_FAILURE;

    /* bail out if CH cannot be handled as TLS 1.3 */
    if (!is_supported_version(ch->selected_version)) {
        /* ECH: server MUST abort with an "illegal_parameter" alert if the client offers TLS 1.2 or below (draft-15 7.1) */
        if (ech_is_inner_ch)
            return PTLS_ALERT_ILLEGAL_PARAMETER;
        /* fail with PROTOCOL_VERSION alert, after providing the applications the raw CH and SNI to help them fallback */
        if (!is_second_flight) {
            int ret;
            if ((ret = call_on_client_hello_cb(tls_cbarg, ch->server_name, raw_message, ch->cipher_suites, ch->alpn.list,
                                               ch->alpn.count, NULL, 0, NULL, 0, NULL, 0, NULL, 0, 1)) != 0)
                return ret;
        }
        return PTLS_ALERT_PROTOCOL_VERSION;
    }

    /* Check TLS 1.3-specific constraints. Hereafter, we might exit without calling on_client_hello. That's fine because this CH is
     * ought to be rejected. */
    if (ch->legacy_version <= 0x0300) {
        /* RFC 8446 Appendix D.5: any endpoint receiving a Hello message with legacy_version set to 0x0300 MUST abort the handshake
         * with a "protocol_version" alert. */
        return PTLS_ALERT_PROTOCOL_VERSION;
    }
    if (!(ch->compression_methods.count == 1 && ch->compression_methods.ids[0] == 0))
        return PTLS_ALERT_ILLEGAL_PARAMETER;
    /* pre-shared key */
    if (ch->psk.hash_end != NULL) {
        /* PSK must be the last extension */
        if (!ch->psk.is_last_extension)
            return PTLS_ALERT_ILLEGAL_PARAMETER;
    } else {
        if (ch->psk.early_data_indication)
            return PTLS_ALERT_ILLEGAL_PARAMETER;
    }

    if (ech_is_inner_ch && ch->ech.payload.base == NULL)
        return PTLS_ALERT_ILLEGAL_PARAMETER;
    if (ch->ech.payload.base != NULL &&
        ch->ech.type != (ech_is_inner_ch ? PTLS_ECH_CLIENT_HELLO_TYPE_INNER : PTLS_ECH_CLIENT_HELLO_TYPE_OUTER))
        return PTLS_ALERT_ILLEGAL_PARAMETER;

    return 0;
}